

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
exe_reconstructor::add_sectioninfo
          (exe_reconstructor *this,string *name,uint64_t size,ReadWriter_ptr *r)

{
  ReadWriter_ptr *size_00;
  uint64_t name_00;
  sectioninfo *this_00;
  shared_ptr<ReadWriter> local_48;
  shared_ptr<exe_reconstructor::sectioninfo> local_38;
  ReadWriter_ptr *local_28;
  ReadWriter_ptr *r_local;
  uint64_t size_local;
  string *name_local;
  exe_reconstructor *this_local;
  
  local_28 = r;
  r_local = (ReadWriter_ptr *)size;
  size_local = (uint64_t)name;
  name_local = (string *)this;
  this_00 = (sectioninfo *)operator_new(0x38);
  name_00 = size_local;
  size_00 = r_local;
  std::shared_ptr<ReadWriter>::shared_ptr(&local_48,r);
  sectioninfo::sectioninfo(this_00,(string *)name_00,(uint64_t)size_00,&local_48);
  std::shared_ptr<exe_reconstructor::sectioninfo>::shared_ptr<exe_reconstructor::sectioninfo,void>
            (&local_38,this_00);
  std::
  vector<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
  ::push_back(&this->_sections,&local_38);
  std::shared_ptr<exe_reconstructor::sectioninfo>::~shared_ptr(&local_38);
  std::shared_ptr<ReadWriter>::~shared_ptr(&local_48);
  return;
}

Assistant:

void add_sectioninfo(const std::string& name, uint64_t size, ReadWriter_ptr r)
    {
        _sections.push_back(sectioninfo_ptr(new sectioninfo(name, size, r)));
    }